

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int set_extra(int argc,char **argv)

{
  char *__s;
  zip_t *pzVar1;
  FILE *__stream;
  zip_flags_t zVar2;
  int iVar3;
  ulonglong uVar4;
  ulonglong uVar5;
  ulonglong uVar6;
  size_t sVar7;
  undefined8 uVar8;
  zip_uint64_t idx;
  zip_uint8_t *efdata;
  zip_uint16_t eidx;
  zip_uint16_t eid;
  zip_flags_t geflags;
  char **argv_local;
  int argc_local;
  
  uVar4 = strtoull(*argv,(char **)0x0,10);
  uVar5 = strtoull(argv[1],(char **)0x0,10);
  uVar6 = strtoull(argv[2],(char **)0x0,10);
  zVar2 = get_flags(argv[3]);
  pzVar1 = za;
  __s = argv[4];
  sVar7 = strlen(__s);
  iVar3 = zip_file_extra_field_set
                    (pzVar1,uVar4,uVar5 & 0xffff,uVar6 & 0xffff,__s,sVar7 & 0xffff,zVar2);
  __stream = _stderr;
  if (iVar3 < 0) {
    uVar8 = zip_strerror(za);
    fprintf(__stream,
            "can\'t set extra field data for file at index \'%lu\', extra field id \'%d\', index \'%d\': %s\n"
            ,uVar4,uVar5 & 0xffff,uVar6 & 0xffff,uVar8);
    argv_local._4_4_ = -1;
  }
  else {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

static int
set_extra(int argc, char *argv[]) {
    zip_flags_t geflags;
    zip_uint16_t eid, eidx;
    const zip_uint8_t *efdata;
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    eid = (zip_uint16_t)strtoull(argv[1], NULL, 10);
    eidx = (zip_uint16_t)strtoull(argv[2], NULL, 10);
    geflags = get_flags(argv[3]);
    efdata = (zip_uint8_t *)argv[4];
    if ((zip_file_extra_field_set(za, idx, eid, eidx, efdata, (zip_uint16_t)strlen((const char *)efdata), geflags)) < 0) {
	fprintf(stderr, "can't set extra field data for file at index '%" PRIu64 "', extra field id '%d', index '%d': %s\n", idx, eid, eidx, zip_strerror(za));
	return -1;
    }
    return 0;
}